

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::session_impl::load_state
          (session_impl *this,bdecode_node *e,save_state_flags_t flags)

{
  pointer psVar1;
  element_type *peVar2;
  undefined8 uVar3;
  pointer ppVar4;
  bool bVar5;
  bool bVar6;
  type_t tVar7;
  shared_ptr<libtorrent::plugin> *ext;
  pointer psVar8;
  string_view key;
  string_view key_00;
  string_view key_01;
  vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> pack;
  bdecode_node settings;
  undefined1 local_b8 [8];
  undefined1 auStack_b0 [16];
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  pointer local_70;
  undefined1 local_68 [16];
  pointer local_58;
  undefined4 uStack_50;
  undefined4 local_4c;
  pointer ppStack_48;
  int iStack_40;
  int local_3c;
  pointer ppStack_38;
  int iStack_30;
  
  ppStack_48 = (pointer)0x0;
  iStack_40 = 0;
  local_58 = (pointer)0x0;
  uStack_50 = 0;
  local_4c = 0;
  local_68 = (undefined1  [16])0x0;
  local_3c = -1;
  ppStack_38 = (pointer)0xffffffffffffffff;
  iStack_30 = -1;
  tVar7 = bdecode_node::type(e);
  if (tVar7 != dict_t) goto LAB_002c591d;
  if ((flags.m_val & 4) == 0) {
LAB_002c56ba:
    bVar5 = false;
  }
  else {
    key._M_str = "dht state";
    key._M_len = 9;
    bdecode_node::dict_find_dict((bdecode_node *)local_b8,e,key);
    ppVar4 = local_58;
    uVar3 = local_68._0_8_;
    local_68._8_8_ = auStack_b0._0_8_;
    local_68._0_8_ = local_b8;
    local_58 = (pointer)auStack_b0._8_8_;
    local_b8 = (undefined1  [8])0x0;
    auStack_b0 = ZEXT816(0);
    if ((pointer)uVar3 != (pointer)0x0) {
      operator_delete((void *)uVar3,(long)ppVar4 - uVar3);
    }
    iStack_30 = local_80._0_4_;
    iStack_40 = local_90._0_4_;
    local_3c = local_90._4_4_;
    ppStack_38 = (pointer)local_90._8_8_;
    uStack_50 = local_a0._0_4_;
    local_4c = local_a0._4_4_;
    ppStack_48 = (pointer)local_a0._8_8_;
    if (local_b8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_b8,auStack_b0._8_8_ - (long)local_b8);
    }
    bVar5 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_68);
    if (!bVar5) goto LAB_002c56ba;
    libtorrent::dht::read_dht_state((dht_state *)local_b8,(bdecode_node *)local_68);
    ::std::
    vector<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
    ::_M_move_assign(&(this->m_dht_state).nids,local_b8);
    ::std::
    vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
    ::_M_move_assign(&(this->m_dht_state).nodes,local_a0);
    ::std::
    vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
    ::_M_move_assign(&(this->m_dht_state).nodes6,local_90 + 8);
    if ((pointer)local_90._8_8_ != (pointer)0x0) {
      operator_delete((void *)local_90._8_8_,local_80._8_8_ - local_90._8_8_);
    }
    if ((pointer)local_a0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_a0._0_8_,local_90._0_8_ - local_a0._0_8_);
    }
    if (local_b8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_b8,auStack_b0._8_8_ - (long)local_b8);
    }
    bVar5 = true;
  }
  if ((flags.m_val & 3) != 0) {
    key_00._M_str = "settings";
    key_00._M_len = 8;
    bdecode_node::dict_find_dict((bdecode_node *)local_b8,e,key_00);
    ppVar4 = local_58;
    uVar3 = local_68._0_8_;
    local_68._8_8_ = auStack_b0._0_8_;
    local_68._0_8_ = local_b8;
    local_58 = (pointer)auStack_b0._8_8_;
    local_b8 = (undefined1  [8])0x0;
    auStack_b0 = ZEXT816(0);
    if ((pointer)uVar3 != (pointer)0x0) {
      operator_delete((void *)uVar3,(long)ppVar4 - uVar3);
    }
    iStack_30 = local_80._0_4_;
    iStack_40 = local_90._0_4_;
    local_3c = local_90._4_4_;
    ppStack_38 = (pointer)local_90._8_8_;
    uStack_50 = local_a0._0_4_;
    local_4c = local_a0._4_4_;
    ppStack_48 = (pointer)local_a0._8_8_;
    if (local_b8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_b8,auStack_b0._8_8_ - (long)local_b8);
    }
    bVar6 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_68);
    if (bVar6) {
      load_pack_from_dict((settings_pack *)local_b8,(bdecode_node *)local_68);
      settings_pack::clear((settings_pack *)local_b8,0);
      settings_pack::clear((settings_pack *)local_b8,10);
      apply_settings_pack_impl
                (this,(vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>
                       *)local_b8);
      if ((pointer)local_80._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_80._0_8_,(long)local_70 - local_80._0_8_);
      }
      if ((pointer)local_a0._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
      }
      ::std::
      vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)auStack_b0);
      bVar5 = false;
    }
  }
  if ((flags.m_val & 2) != 0) {
    key_01._M_str = "dht";
    key_01._M_len = 3;
    bdecode_node::dict_find_dict((bdecode_node *)local_b8,e,key_01);
    ppVar4 = local_58;
    uVar3 = local_68._0_8_;
    local_68._8_8_ = auStack_b0._0_8_;
    local_68._0_8_ = local_b8;
    local_58 = (pointer)auStack_b0._8_8_;
    local_b8 = (undefined1  [8])0x0;
    auStack_b0 = ZEXT816(0);
    if ((pointer)uVar3 != (pointer)0x0) {
      operator_delete((void *)uVar3,(long)ppVar4 - uVar3);
    }
    iStack_30 = local_80._0_4_;
    iStack_40 = local_90._0_4_;
    local_3c = local_90._4_4_;
    ppStack_38 = (pointer)local_90._8_8_;
    uStack_50 = local_a0._0_4_;
    local_4c = local_a0._4_4_;
    ppStack_48 = (pointer)local_a0._8_8_;
    if (local_b8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_b8,auStack_b0._8_8_ - (long)local_b8);
    }
    bVar6 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_68);
    if (bVar6) {
      local_b8 = (undefined1  [8])&PTR_set_str_004f5058;
      auStack_b0 = (undefined1  [16])0x0;
      local_a0 = (undefined1  [16])0x0;
      local_90 = (undefined1  [16])0x0;
      local_80 = (undefined1  [16])0x0;
      local_70 = (pointer)0x0;
      apply_deprecated_dht_settings
                ((vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> *)
                 local_b8,(bdecode_node *)local_68);
      apply_settings_pack_impl
                (this,(vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>
                       *)local_b8);
      if ((pointer)local_80._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_80._0_8_,(long)local_70 - local_80._0_8_);
      }
      if ((pointer)local_a0._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_a0._8_8_,local_90._8_8_ - local_a0._8_8_);
      }
      ::std::
      vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)auStack_b0);
    }
  }
  if (bVar5) {
    start_dht(this);
  }
  psVar1 = (this->m_ses_extensions)._M_elems[0].
           super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar8 = (this->m_ses_extensions)._M_elems[0].
                super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar8 != psVar1; psVar8 = psVar8 + 1) {
    peVar2 = (psVar8->super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar2->_vptr_plugin[0xc])(peVar2,e);
  }
LAB_002c591d:
  if ((pointer)local_68._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_68._0_8_,(long)local_58 - local_68._0_8_);
  }
  return;
}

Assistant:

void session_impl::load_state(bdecode_node const* e
		, save_state_flags_t const flags)
	{
		TORRENT_ASSERT(is_single_thread());

		bdecode_node settings;
		if (e->type() != bdecode_node::dict_t) return;

#ifndef TORRENT_DISABLE_DHT
		bool need_update_dht = false;
		if (flags & session_handle::save_dht_state)
		{
			settings = e->dict_find_dict("dht state");
			if (settings)
			{
				m_dht_state = dht::read_dht_state(settings);
				need_update_dht = true;
			}
		}
#endif

#if TORRENT_ABI_VERSION == 1
		bool need_update_proxy = false;
		if (flags & session_handle::save_proxy)
		{
			settings = e->dict_find_dict("proxy");
			if (settings)
			{
				m_settings.bulk_set([&settings](session_settings_single_thread& s)
				{
					bdecode_node val;
					val = settings.dict_find_int("port");
					if (val) s.set_int(settings_pack::proxy_port, int(val.int_value()));
					val = settings.dict_find_int("type");
					if (val) s.set_int(settings_pack::proxy_type, int(val.int_value()));
					val = settings.dict_find_int("proxy_hostnames");
					if (val) s.set_bool(settings_pack::proxy_hostnames, val.int_value() != 0);
					val = settings.dict_find_int("proxy_peer_connections");
					if (val) s.set_bool(settings_pack::proxy_peer_connections, val.int_value() != 0);
					val = settings.dict_find_string("hostname");
					if (val) s.set_str(settings_pack::proxy_hostname, std::string(val.string_value()));
					val = settings.dict_find_string("password");
					if (val) s.set_str(settings_pack::proxy_password, std::string(val.string_value()));
					val = settings.dict_find_string("username");
					if (val) s.set_str(settings_pack::proxy_username, std::string(val.string_value()));
				});
				need_update_proxy = true;
			}
		}

		settings = e->dict_find_dict("encryption");
		if (settings)
		{
			m_settings.bulk_set([&settings](session_settings_single_thread& s)
			{
				bdecode_node val;
				val = settings.dict_find_int("prefer_rc4");
				if (val) s.set_bool(settings_pack::prefer_rc4, val.int_value() != 0);
				val = settings.dict_find_int("out_enc_policy");
				if (val) s.set_int(settings_pack::out_enc_policy, int(val.int_value()));
				val = settings.dict_find_int("in_enc_policy");
				if (val) s.set_int(settings_pack::in_enc_policy, int(val.int_value()));
				val = settings.dict_find_int("allowed_enc_level");
				if (val) s.set_int(settings_pack::allowed_enc_level, int(val.int_value()));
			});
		}
#endif

		if ((flags & session_handle::save_settings)
			|| (flags & session_handle::save_dht_settings)
			)
		{
			settings = e->dict_find_dict("settings");
			if (settings)
			{
				// apply_settings_pack will update dht and proxy
				settings_pack pack = load_pack_from_dict(settings);

				// these settings are not loaded from state
				// they are set by the client software, not configured by users
				pack.clear(settings_pack::user_agent);
				pack.clear(settings_pack::peer_fingerprint);

				apply_settings_pack_impl(pack);
#ifndef TORRENT_DISABLE_DHT
				need_update_dht = false;
#endif
#if TORRENT_ABI_VERSION == 1
				need_update_proxy = false;
#endif
			}
		}

		if (flags & session_handle::save_dht_settings)
		{
			// This is here for backwards compatibility, to support loading state
			// files in the previous file format, where the DHT settings were in
			// its own dictionary
			settings = e->dict_find_dict("dht");
			if (settings)
			{
				settings_pack sett;
				aux::apply_deprecated_dht_settings(sett, settings);
				apply_settings_pack_impl(sett);
			}
		}

#ifndef TORRENT_DISABLE_DHT
		if (need_update_dht) start_dht();
#endif
#if TORRENT_ABI_VERSION == 1
		if (need_update_proxy) update_proxy();
#endif

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto& ext : m_ses_extensions[plugins_all_idx])
		{
			ext->load_state(*e);
		}
#endif
	}